

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FederateInfo.cpp
# Opt level: O3

void __thiscall
helics::FederateInfo::loadInfoFromArgsIgnoreOutput(FederateInfo *this,int argc,char **argv)

{
  ParseOutput PVar1;
  HelicsException *this_00;
  pointer *__ptr;
  string_view message;
  helicsCLI11App *local_38;
  int local_2c;
  pointer local_28;
  
  local_2c = argc;
  local_28 = (pointer)argv;
  makeCLIApp((FederateInfo *)&stack0xffffffffffffffc8);
  PVar1 = helicsCLI11App::helics_parse<int&,char**&>
                    (local_38,&stack0xffffffffffffffd4,(char ***)&stack0xffffffffffffffd8);
  if (PVar1 != PARSE_ERROR) {
    config_additional(this,&local_38->super_App);
    if (local_38 != (helicsCLI11App *)0x0) {
      (*(local_38->super_App)._vptr_App[1])();
    }
    return;
  }
  this_00 = (HelicsException *)__cxa_allocate_exception(0x28);
  message._M_str = "argument parsing failed";
  message._M_len = 0x17;
  HelicsException::HelicsException(this_00,message);
  *(undefined ***)this_00 = &PTR__HelicsException_00541a58;
  __cxa_throw(this_00,&InvalidParameter::typeinfo,HelicsException::~HelicsException);
}

Assistant:

void FederateInfo::loadInfoFromArgsIgnoreOutput(int argc, char* argv[])
{
    auto app = makeCLIApp();
    auto ret = app->helics_parse(argc, argv);
    if (ret == helicsCLI11App::ParseOutput::PARSE_ERROR) {
        throw helics::InvalidParameter("argument parsing failed");
    }
    config_additional(app.get());
}